

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootCheck3(void *arkode_mem)

{
  double dVar1;
  N_Vector in_RDI;
  realtype unaff_retaddr;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int ier;
  int retval;
  int i;
  void *in_stack_00000038;
  N_Vector in_stack_ffffffffffffffc8;
  SUNContext c;
  int local_14;
  N_Vector dky;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootCheck3","arkode_mem = NULL illegal.");
    iVar2 = -0x15;
  }
  else {
    c = in_RDI[0x1a].sunctx;
    dky = in_RDI;
    if (*(int *)&c[3].profiler == 2) {
      *(void **)&c[1].own_profiler = in_RDI[0x11].content;
      N_VScale((realtype)c,in_stack_ffffffffffffffc8,(N_Vector)0xebd515);
    }
    if (*(int *)&c[3].profiler == 1) {
      if (((double)c[2].logger - (double)in_RDI[0x11].content) * (double)in_RDI[0xf].content < 0.0)
      {
        *(SUNLogger *)&c[1].own_profiler = c[2].logger;
        arkGetDky((ARKodeMem)rootmem,unaff_retaddr,in_stack_fffffffffffffffc,dky);
      }
      else {
        *(void **)&c[1].own_profiler = in_RDI[0x11].content;
        N_VScale((realtype)c,in_stack_ffffffffffffffc8,(N_Vector)0xebd58d);
      }
    }
    iVar2 = (*(code *)c->profiler)
                      (*(undefined8 *)&c[1].own_profiler,in_RDI[0xb].content,c[2].profiler,
                       c[4].profiler);
    *(long *)&c[3].own_profiler = *(long *)&c[3].own_profiler + 1;
    if (iVar2 == 0) {
      *(double *)&c[2].own_logger =
           (ABS((double)in_RDI[0x11].content) + ABS((double)in_RDI[0xf].content)) *
           (double)in_RDI->ops * 100.0;
      iVar2 = arkRootfind(in_stack_00000038);
      if (iVar2 == -0xc) {
        iVar2 = -0xc;
      }
      else {
        for (local_14 = 0; local_14 < c->own_profiler; local_14 = local_14 + 1) {
          if ((*(int *)((long)&(c[3].logger)->commptr + (long)local_14 * 4) == 0) &&
             ((dVar1 = *(double *)(*(long *)&c[2].own_profiler + (long)local_14 * 8), dVar1 != 0.0
              || (NAN(dVar1))))) {
            *(undefined4 *)((long)&(c[3].logger)->commptr + (long)local_14 * 4) = 1;
          }
        }
        c[1].profiler = (SUNProfiler)c[1].logger;
        for (local_14 = 0; local_14 < c->own_profiler; local_14 = local_14 + 1) {
          *(undefined8 *)(*(long *)&c[1].own_logger + (long)local_14 * 8) =
               *(undefined8 *)(*(long *)&c[2].own_profiler + (long)local_14 * 8);
        }
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          arkGetDky((ARKodeMem)rootmem,unaff_retaddr,in_stack_fffffffffffffffc,dky);
          iVar2 = 1;
        }
      }
    }
    else {
      iVar2 = -0xc;
    }
  }
  return iVar2;
}

Assistant:

int arkRootCheck3(void* arkode_mem)
{
  int i, retval, ier;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootCheck3", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  rootmem = ark_mem->root_mem;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (rootmem->taskc == ARK_ONE_STEP) {
    rootmem->thi = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  }
  if (rootmem->taskc == ARK_NORMAL) {
    if ( (rootmem->toutc - ark_mem->tcur)*ark_mem->h >= ZERO) {
      rootmem->thi = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
    } else {
      rootmem->thi = rootmem->toutc;
      (void) arkGetDky(ark_mem, rootmem->thi, 0, ark_mem->ycur);
    }
  }

  /* Set rootmem->ghi = g(thi) and call arkRootfind to search (tlo,thi) for roots. */
  retval = rootmem->gfun(rootmem->thi, ark_mem->ycur,
                         rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) return(ARK_RTFUNC_FAIL);

  rootmem->ttol = (SUNRabs(ark_mem->tcur) +
                   SUNRabs(ark_mem->h))*ark_mem->uround*HUND;
  ier = arkRootfind(ark_mem);
  if (ier == ARK_RTFUNC_FAIL) return(ARK_RTFUNC_FAIL);
  for(i=0; i<rootmem->nrtfn; i++) {
    if (!rootmem->gactive[i] && rootmem->grout[i] != ZERO)
      rootmem->gactive[i] = SUNTRUE;
  }
  rootmem->tlo = rootmem->trout;
  for (i = 0; i < rootmem->nrtfn; i++)
    rootmem->glo[i] = rootmem->grout[i];

  /* If no root found, return ARK_SUCCESS. */
  if (ier == ARK_SUCCESS) return(ARK_SUCCESS);

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void) arkGetDky(ark_mem, rootmem->trout, 0, ark_mem->ycur);
  return(RTFOUND);
}